

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

FloatConstantKind spvtools::opt::anon_unknown_0::getFloatConstantKind(Constant *constant)

{
  bool bVar1;
  int iVar2;
  FloatConstantKind FVar3;
  uint uVar4;
  uint32_t uVar5;
  Type *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *this;
  const_reference ppCVar7;
  FloatConstant *pFVar8;
  Constant *this_00;
  undefined4 extraout_var_02;
  float fVar9;
  double local_68;
  double value;
  uint32_t width;
  FloatConstant *fc;
  size_t i;
  FloatConstantKind kind;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *components;
  VectorConstant *vc;
  Constant *constant_local;
  undefined4 extraout_var_01;
  
  if (constant == (Constant *)0x0) {
    constant_local._4_4_ = Unknown;
  }
  else {
    pTVar6 = analysis::Constant::type(constant);
    bVar1 = HasFloatingPoint(pTVar6);
    if (!bVar1) {
      __assert_fail("HasFloatingPoint(constant->type()) && \"Unexpected constant type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x903,
                    "FloatConstantKind spvtools::opt::(anonymous namespace)::getFloatConstantKind(const analysis::Constant *)"
                   );
    }
    iVar2 = (*constant->_vptr_Constant[0x16])();
    if (CONCAT44(extraout_var,iVar2) == 0) {
      iVar2 = (*constant->_vptr_Constant[0x13])();
      if ((long *)CONCAT44(extraout_var_00,iVar2) == (long *)0x0) {
        iVar2 = (*constant->_vptr_Constant[0xf])();
        this_00 = (Constant *)CONCAT44(extraout_var_01,iVar2);
        if (this_00 == (Constant *)0x0) {
          constant_local._4_4_ = Unknown;
        }
        else {
          uVar4 = (*this_00->_vptr_Constant[0x17])();
          if ((uVar4 & 1) == 0) {
            pTVar6 = analysis::Constant::type(this_00);
            iVar2 = (*pTVar6->_vptr_Type[0xc])();
            uVar5 = analysis::Float::width((Float *)CONCAT44(extraout_var_02,iVar2));
            if ((uVar5 == 0x20) || (uVar5 == 0x40)) {
              if (uVar5 == 0x40) {
                local_68 = analysis::FloatConstant::GetDoubleValue((FloatConstant *)this_00);
              }
              else {
                fVar9 = analysis::FloatConstant::GetFloatValue((FloatConstant *)this_00);
                local_68 = (double)fVar9;
              }
              if ((local_68 != 0.0) || (NAN(local_68))) {
                if ((local_68 != 1.0) || (NAN(local_68))) {
                  constant_local._4_4_ = Unknown;
                }
                else {
                  constant_local._4_4_ = One;
                }
              }
              else {
                constant_local._4_4_ = Zero;
              }
            }
            else {
              constant_local._4_4_ = Unknown;
            }
          }
          else {
            constant_local._4_4_ = Zero;
          }
        }
      }
      else {
        this = (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0xc0))();
        bVar1 = std::
                vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                ::empty(this);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          __assert_fail("!components.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                        ,0x90b,
                        "FloatConstantKind spvtools::opt::(anonymous namespace)::getFloatConstantKind(const analysis::Constant *)"
                       );
        }
        ppCVar7 = std::
                  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ::operator[](this,0);
        constant_local._4_4_ = getFloatConstantKind(*ppCVar7);
        for (fc = (FloatConstant *)0x1;
            pFVar8 = (FloatConstant *)
                     std::
                     vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                     ::size(this), fc < pFVar8;
            fc = (FloatConstant *)
                 ((long)&(fc->super_ScalarConstant).super_Constant._vptr_Constant + 1)) {
          ppCVar7 = std::
                    vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    ::operator[](this,(size_type)fc);
          FVar3 = getFloatConstantKind(*ppCVar7);
          if (FVar3 != constant_local._4_4_) {
            return Unknown;
          }
        }
      }
    }
    else {
      constant_local._4_4_ = Zero;
    }
  }
  return constant_local._4_4_;
}

Assistant:

FloatConstantKind getFloatConstantKind(const analysis::Constant* constant) {
  if (constant == nullptr) {
    return FloatConstantKind::Unknown;
  }

  assert(HasFloatingPoint(constant->type()) && "Unexpected constant type");

  if (constant->AsNullConstant()) {
    return FloatConstantKind::Zero;
  } else if (const analysis::VectorConstant* vc =
                 constant->AsVectorConstant()) {
    const std::vector<const analysis::Constant*>& components =
        vc->GetComponents();
    assert(!components.empty());

    FloatConstantKind kind = getFloatConstantKind(components[0]);

    for (size_t i = 1; i < components.size(); ++i) {
      if (getFloatConstantKind(components[i]) != kind) {
        return FloatConstantKind::Unknown;
      }
    }

    return kind;
  } else if (const analysis::FloatConstant* fc = constant->AsFloatConstant()) {
    if (fc->IsZero()) return FloatConstantKind::Zero;

    uint32_t width = fc->type()->AsFloat()->width();
    if (width != 32 && width != 64) return FloatConstantKind::Unknown;

    double value = (width == 64) ? fc->GetDoubleValue() : fc->GetFloatValue();

    if (value == 0.0) {
      return FloatConstantKind::Zero;
    } else if (value == 1.0) {
      return FloatConstantKind::One;
    } else {
      return FloatConstantKind::Unknown;
    }
  } else {
    return FloatConstantKind::Unknown;
  }
}